

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.cpp
# Opt level: O0

AnnotationResolver * __thiscall
snestistics::AnnotationResolver::data_label
          (AnnotationResolver *this,Pointer p,string *use_comment,bool force)

{
  ulong uVar1;
  undefined7 in_register_00000009;
  undefined4 in_register_00000034;
  byte in_R8B;
  byte local_69;
  allocator local_68;
  char local_67 [7];
  char cStack_60;
  char t [7];
  string local_50 [8];
  string l;
  bool force_local;
  string *use_comment_local;
  Pointer p_local;
  AnnotationResolver *this_local;
  
  local_69 = 1;
  if ((string *)CONCAT71(in_register_00000009,force) != (string *)0x0) {
    local_69 = std::__cxx11::string::empty();
  }
  if ((local_69 & 1) != 0) {
    std::__cxx11::string::string(local_50);
    line_info((AnnotationResolver *)CONCAT44(in_register_00000034,p),(Pointer)use_comment,
              (string *)local_50,(string *)0x0,(string *)CONCAT71(in_register_00000009,force),false)
    ;
    uVar1 = std::__cxx11::string::empty();
    if (((uVar1 & 1) == 0) || ((in_R8B & 1) == 0)) {
      std::__cxx11::string::string((string *)this,local_50);
    }
    else {
      sprintf(local_67,"data_%0X",(ulong)use_comment & 0xffffffff);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,local_67,&local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_68);
    }
    cStack_60 = '\x01';
    t[0] = '\0';
    t[1] = '\0';
    t[2] = '\0';
    std::__cxx11::string::~string(local_50);
    return this;
  }
  __assert_fail("!use_comment || use_comment->empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/annotations.cpp"
                ,0x231,
                "std::string snestistics::AnnotationResolver::data_label(const Pointer, std::string *, const bool) const"
               );
}

Assistant:

std::string AnnotationResolver::data_label(const Pointer p, std::string * use_comment, const bool force) const {
	assert(!use_comment || use_comment->empty());
	std::string l;
	line_info(p, &l, nullptr, use_comment, false);
	if (!l.empty() || !force)
		return l;
	char t[7];
	sprintf(t, "data_%0X", p);
	return std::string(t);
}